

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

void If_ManMarkMapping(If_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  If_Obj_t *pIVar3;
  float fVar4;
  int local_1c;
  int i;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
    *(undefined4 *)((long)pvVar2 + 0x34) = 0x60ad78ec;
    *(undefined4 *)((long)pvVar2 + 0x10) = *(undefined4 *)((long)pvVar2 + 0x14);
    *(undefined4 *)((long)pvVar2 + 0xc) = 0;
  }
  p->nNets = 0;
  p->dPower = 0.0;
  p->AreaGlo = 0.0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCos), local_1c < iVar1; local_1c = local_1c + 1) {
    pIVar3 = (If_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    pIVar3 = If_ObjFanin0(pIVar3);
    fVar4 = If_ManMarkMapping_rec(p,pIVar3);
    p->AreaGlo = fVar4 + p->AreaGlo;
  }
  return;
}

Assistant:

void If_ManMarkMapping( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    If_ManForEachObj( p, pObj, i )
    {
        pObj->Required = IF_FLOAT_LARGE;
        pObj->nVisits = pObj->nVisitsCopy;
        pObj->nRefs = 0;
    }
    p->nNets = 0;
    p->dPower = 0.0;
    p->AreaGlo = 0.0;
    If_ManForEachCo( p, pObj, i )
        p->AreaGlo += If_ManMarkMapping_rec( p, If_ObjFanin0(pObj) );
}